

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

plutovg_path_element_t *
plutovg_path_add_command(plutovg_path_t *path,plutovg_path_command_t command,int npoints)

{
  int *piVar1;
  int iVar2;
  plutovg_path_element_t *ppVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = (path->elements).size;
  iVar4 = (path->elements).capacity;
  iVar2 = iVar5 + npoints + 1;
  if (iVar4 < iVar2) {
    iVar5 = 8;
    if (iVar4 != 0) {
      iVar5 = iVar4;
    }
    do {
      iVar4 = iVar5;
      iVar5 = iVar4 * 2;
    } while (iVar4 < iVar2);
    ppVar3 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar4 << 3);
    (path->elements).data = ppVar3;
    (path->elements).capacity = iVar4;
    iVar5 = (path->elements).size;
  }
  else {
    ppVar3 = (path->elements).data;
  }
  ppVar3 = ppVar3 + iVar5;
  (ppVar3->header).command = command;
  *(int *)((long)ppVar3 + 4) = npoints + 1;
  piVar1 = &(path->elements).size;
  *piVar1 = *piVar1 + npoints + 1;
  path->num_points = path->num_points + npoints;
  return ppVar3 + 1;
}

Assistant:

static plutovg_path_element_t* plutovg_path_add_command(plutovg_path_t* path, plutovg_path_command_t command, int npoints)
{
    const int length = npoints + 1;
    plutovg_array_ensure(path->elements, length);
    plutovg_path_element_t* elements = path->elements.data + path->elements.size;
    elements->header.command = command;
    elements->header.length = length;
    path->elements.size += length;
    path->num_points += npoints;
    return elements + 1;
}